

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool __thiscall ReqHandler::do_GET(ReqHandler *this,HttpReqInfo *httpReq,string *strSnd)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  HttpReqInfo *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string tmp;
  string sentence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000f8;
  string *in_stack_00000100;
  string *in_stack_ffffffffffffff38;
  allocator *sIn;
  allocator local_91;
  string local_90 [56];
  string local_58 [32];
  string local_38 [32];
  string *str;
  HttpReqInfo *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x134e8d);
  sIn = &local_91;
  str = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"key",sIn);
  Husky::HttpReqInfo::GET(in_RDI,in_stack_ffffffffffffff38,(string *)0x134ed5);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Husky::URLDecode((string *)sIn,in_RSI);
  CppJieba::SegmentBase::cut((SegmentBase *)this_00,str,in_RDX);
  std::operator<<(in_stack_00000100,in_stack_000000f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)sIn);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

virtual bool do_GET(const HttpReqInfo& httpReq, string& strSnd)
        {
            string sentence, tmp;
            vector<string> words;
            httpReq.GET("key", tmp); 
            URLDecode(tmp, sentence);
            _segment.cut(sentence, words);
            strSnd << words;
            return true;
        }